

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_core.c
# Opt level: O0

_Bool list_join(gravity_vm *vm,gravity_value_t *args,uint16_t nargs,uint32_t rindex)

{
  uint uVar1;
  gravity_object_t *pgVar2;
  gravity_class_t *pgVar3;
  gravity_class_t *__src;
  gravity_value_t value_00;
  gravity_value_t value_01;
  anon_union_8_3_4e90ac68_for_gravity_value_t_1 aVar4;
  gravity_value_t gVar5;
  uint local_c4;
  gravity_string_t *result;
  uint64_t to_alloc;
  uint32_t free_mem;
  uint32_t req;
  char *s2;
  gravity_value_t value;
  gravity_int_t i;
  gravity_int_t n;
  char *local_50;
  char *_buffer;
  uint local_40;
  uint32_t seplen;
  uint32_t len;
  uint32_t alloc;
  char *sep;
  gravity_list_t *list;
  uint32_t rindex_local;
  uint16_t nargs_local;
  gravity_value_t *args_local;
  gravity_vm *vm_local;
  
  pgVar2 = (args->field_1).p;
  _len = (gravity_class_t *)0x0;
  if ((1 < nargs) && (args[1].isa == gravity_class_string)) {
    _len = (args[1].field_1.p)->objclass;
  }
  seplen = (uint32_t)((long)pgVar2->objclass << 6);
  if (seplen == 0) {
    seplen = 0x100;
  }
  local_40 = 0;
  if (_len == (gravity_class_t *)0x0) {
    local_c4 = 0;
  }
  else {
    local_c4 = *(uint *)((long)&(args[1].field_1.p)->identifier + 4);
  }
  local_50 = (char *)gravity_calloc(vm,1,(ulong)seplen);
  if (local_50 == (char *)0x0) {
    value_01.field_1.n = 0;
    value_01.isa = gravity_class_null;
    gravity_vm_setslot(vm,value_01,rindex);
    vm_local._7_1_ = false;
  }
  else {
    pgVar3 = pgVar2->objclass;
    for (value.field_1.n = 0; value.field_1.n < (long)pgVar3;
        value.field_1.p = (gravity_object_t *)((long)&(value.field_1.p)->isa + 1)) {
      gVar5 = convert_value2string
                        (vm,*(gravity_value_t *)
                             (*(long *)&pgVar2->has_outer + value.field_1.n * 0x10));
      s2 = (char *)gVar5.isa;
      if (s2 == (char *)0x0) {
        free(local_50);
        gravity_vm_setslot(vm,gVar5,rindex);
        return true;
      }
      value.isa = (gravity_class_t *)gVar5.field_1;
      __src = (value.isa)->objclass;
      uVar1 = *(uint *)((long)&(value.isa)->identifier + 4);
      if (seplen - local_40 < uVar1 + local_c4 + 1) {
        seplen = seplen + (uVar1 + local_c4) * 2 + 0x1000;
        local_50 = (char *)gravity_realloc(vm,local_50,(ulong)seplen);
        if (local_50 == (char *)0x0) {
          free((void *)0x0);
          gVar5.field_1.n = 0;
          gVar5.isa = gravity_class_null;
          gravity_vm_setslot(vm,gVar5,rindex);
          return false;
        }
      }
      memcpy(local_50 + local_40,__src,(ulong)uVar1);
      local_40 = uVar1 + local_40;
      local_50[local_40] = '\0';
      if (((long)((long)&(value.field_1.p)->isa + 1) < (long)pgVar3) && (local_c4 != 0)) {
        memcpy(local_50 + local_40,_len,(ulong)local_c4);
        local_40 = local_c4 + local_40;
        local_50[local_40] = '\0';
      }
    }
    aVar4.p = (gravity_object_t *)gravity_string_new(vm,local_50,local_40,seplen);
    value_00.field_1.p = (gravity_object_t *)aVar4.n;
    value_00.isa = (aVar4.p)->isa;
    gravity_vm_setslot(vm,value_00,rindex);
    vm_local._7_1_ = true;
  }
  return vm_local._7_1_;
}

Assistant:

static bool list_join (gravity_vm *vm, gravity_value_t *args, uint16_t nargs, uint32_t rindex) {
    gravity_list_t *list = VALUE_AS_LIST(GET_VALUE(0));
    const char *sep = NULL;
    if ((nargs > 1) && VALUE_ISA_STRING(GET_VALUE(1))) sep = VALUE_AS_CSTRING(GET_VALUE(1));

    // create a new empty buffer
    uint32_t alloc = (uint32_t) (marray_size(list->array) * 64);
    if (alloc == 0) alloc = 256;
    uint32_t len = 0;
    uint32_t seplen = (sep) ? VALUE_AS_STRING(GET_VALUE(1))->len : 0;
    char *_buffer = mem_alloc(vm, alloc);
    CHECK_MEM_ALLOC(_buffer);

    register gravity_int_t n = marray_size(list->array);
    register gravity_int_t i = 0;

    // traverse list and append each item
    while (i < n) {
        gravity_value_t value = convert_value2string(vm, marray_get(list->array, i));
        if (VALUE_ISA_ERROR(value)) {
            mem_free(_buffer);
            RETURN_VALUE(value, rindex);
        }

        // compute string to append
        const char *s2 = VALUE_AS_STRING(value)->s;
        uint32_t req = VALUE_AS_STRING(value)->len;
        uint32_t free_mem = alloc - len;

        // check if buffer needs to be reallocated
        if (free_mem < req + seplen + 1) {
            uint64_t to_alloc = alloc + (req + seplen) * 2 + 4096;
            _buffer = mem_realloc(vm, _buffer, (uint32_t)to_alloc);
            if (!_buffer) {
                mem_free(_buffer);
                RETURN_ERROR_SIMPLE();
            }
            alloc = (uint32_t)to_alloc;
        }

        // copy s2 to into buffer
        memcpy(_buffer+len, s2, req);
        len += req;

        // NULL terminate the C string
        _buffer[len] = 0;
        
        // check for separator string
        if (i+1 < n && seplen) {
            memcpy(_buffer+len, sep, seplen);
            len += seplen;
            _buffer[len] = 0;
        }

        ++i;
    }

    gravity_string_t *result = gravity_string_new(vm, _buffer, len, alloc);
    RETURN_VALUE(VALUE_FROM_OBJECT(result), rindex);
}